

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

size_t size_code_gen_buffer(size_t tb_size)

{
  undefined8 local_10;
  size_t tb_size_local;
  
  local_10 = tb_size;
  if (tb_size == 0) {
    local_10 = 0x40000000;
  }
  if (local_10 < 0x100000) {
    local_10 = 0x100000;
  }
  if (0x80000000 < local_10) {
    local_10 = 0x80000000;
  }
  return local_10;
}

Assistant:

static inline size_t size_code_gen_buffer(size_t tb_size)
{
    /* Size the buffer.  */
    if (tb_size == 0) {
        tb_size = DEFAULT_CODE_GEN_BUFFER_SIZE;
    }
    if (tb_size < MIN_CODE_GEN_BUFFER_SIZE) {
        tb_size = MIN_CODE_GEN_BUFFER_SIZE;
    }
    if (tb_size > MAX_CODE_GEN_BUFFER_SIZE) {
        tb_size = MAX_CODE_GEN_BUFFER_SIZE;
    }
    return tb_size;
}